

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QOffscreenScreen_*>::begin(QList<QOffscreenScreen_*> *this)

{
  QOffscreenScreen **n;
  QArrayDataPointer<QOffscreenScreen_*> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QOffscreenScreen_*> *)0x10d989);
  QArrayDataPointer<QOffscreenScreen_*>::operator->(in_RDI);
  n = QArrayDataPointer<QOffscreenScreen_*>::begin
                ((QArrayDataPointer<QOffscreenScreen_*> *)0x10d99a);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }